

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testStringToDouble(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  string value;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"123.45",&local_41);
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < count) {
    iVar3 = count;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::DoubleConvertor::convert(&local_40);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&local_40);
  return lVar2 - lVar1;
}

Assistant:

long testStringToDouble(int count) {
  std::string value("123.45");
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::DoubleConvertor::convert(value);
  }
  return GetTickCount() - start;
}